

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateClone
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldGenerator *pFVar2;
  long lVar3;
  long lVar4;
  
  io::Printer::Print(printer,"@Override\npublic $classname$ clone() {\n","classname",
                     *(string **)this->descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "$classname$ cloned;\ntry {\n  cloned = ($classname$) super.clone();\n} catch (java.lang.CloneNotSupportedException e) {\n  throw new java.lang.AssertionError(e);\n}\n"
                     ,"classname",*(string **)this->descriptor_);
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
      (*pFVar2->_vptr_FieldGenerator[0xc])(pFVar2,printer);
      lVar4 = lVar4 + 1;
      pDVar1 = this->descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar1 + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return cloned;\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateClone(io::Printer* printer) {
  printer->Print(
    "@Override\n"
    "public $classname$ clone() {\n",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "$classname$ cloned;\n"
    "try {\n"
    "  cloned = ($classname$) super.clone();\n"
    "} catch (java.lang.CloneNotSupportedException e) {\n"
    "  throw new java.lang.AssertionError(e);\n"
    "}\n",
    "classname", descriptor_->name());

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateFixClonedCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "  return cloned;\n"
    "}\n"
    "\n");
}